

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::interval_t,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  interval_t *input_00;
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  idx_t iVar7;
  ulong uVar8;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_a0;
  AggregateUnaryInput local_58;
  ValidityMask *local_40;
  unsigned_long *local_38;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_a0.data = (data_ptr_t)&input->validity;
    local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      uVar8 = 0;
      local_a0.sel = (SelectionVector *)aggr_input_data;
      local_40 = (ValidityMask *)local_a0.data;
      local_38 = (unsigned_long *)count;
      do {
        puVar3 = local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar5 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = puVar5[uVar8];
        }
        puVar5 = local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8;
        if (local_38 <=
            local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8) {
          puVar5 = local_38;
        }
        puVar4 = puVar5;
        if (uVar6 != 0) {
          if (uVar6 == 0xffffffffffffffff) {
            for (; puVar4 = local_a0.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar5;
                local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_a0.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              QuantileOperation::
              Operation<duckdb::interval_t,duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                        ((QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *)state,
                         (interval_t *)
                         (pdVar1 + (long)local_a0.validity.
                                         super_TemplatedValidityMask<unsigned_long>.validity_mask *
                                   0x10),(AggregateUnaryInput *)&local_a0);
            }
          }
          else {
            for (; puVar4 = local_a0.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar5;
                local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_a0.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              if ((uVar6 >> ((ulong)(uint)((int)local_a0.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar3) & 0x3f) & 1) != 0) {
                QuantileOperation::
                Operation<duckdb::interval_t,duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                          ((QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *)state,
                           (interval_t *)
                           (pdVar1 + (long)local_a0.validity.
                                           super_TemplatedValidityMask<unsigned_long>.validity_mask
                                     * 0x10),(AggregateUnaryInput *)&local_a0);
              }
            }
          }
        }
        local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
        uVar8 = uVar8 + 1;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar5 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
      input_00 = (interval_t *)input->data;
      local_a0.data = (data_ptr_t)&input->validity;
      local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      if (count != 0) {
        local_a0.sel = (SelectionVector *)aggr_input_data;
        do {
          QuantileOperation::
          Operation<duckdb::interval_t,duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                    ((QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *)state,
                     input_00,(AggregateUnaryInput *)&local_a0);
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_a0);
    Vector::ToUnifiedFormat(input,count,&local_a0);
    local_58.input_mask = &local_a0.validity;
    local_58.input_idx = 0;
    local_58.input = aggr_input_data;
    if (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar2 = (local_a0.sel)->sel_vector;
        iVar7 = 0;
        do {
          local_58.input_idx = iVar7;
          if (psVar2 != (sel_t *)0x0) {
            local_58.input_idx = (idx_t)psVar2[iVar7];
          }
          QuantileOperation::
          Operation<duckdb::interval_t,duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                    ((QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *)state,
                     (interval_t *)(local_a0.data + local_58.input_idx * 0x10),&local_58);
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
      }
    }
    else if (count != 0) {
      psVar2 = (local_a0.sel)->sel_vector;
      iVar7 = 0;
      do {
        local_58.input_idx = iVar7;
        if (psVar2 != (sel_t *)0x0) {
          local_58.input_idx = (idx_t)psVar2[iVar7];
        }
        if ((local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_58.input_idx >> 6] >> (local_58.input_idx & 0x3f) & 1) != 0)) {
          QuantileOperation::
          Operation<duckdb::interval_t,duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                    ((QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *)state,
                     (interval_t *)(local_a0.data + local_58.input_idx * 0x10),&local_58);
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_a0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}